

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalAddSubtract<duckdb::SubtractOperator,duckdb::DecimalSubtractOverflowCheck,true>
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer pDVar1;
  undefined8 local_40;
  _Any_data local_38;
  code *local_28;
  
  BindDecimalArithmetic<false>((duckdb *)&local_40,context,bound_function,arguments);
  pDVar1 = unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
           ::operator->((unique_ptr<duckdb::DecimalArithmeticBindData,_std::default_delete<duckdb::DecimalArithmeticBindData>,_true>
                         *)&local_40);
  if (pDVar1->check_overflow == true) {
    GetScalarBinaryFunction<duckdb::DecimalSubtractOverflowCheck>
              ((scalar_function_t *)&local_38,
               (bound_function->super_BaseScalarFunction).return_type.physical_type_);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&bound_function->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  else {
    GetScalarBinaryFunction<duckdb::SubtractOperator>
              ((scalar_function_t *)&local_38,
               (bound_function->super_BaseScalarFunction).return_type.physical_type_);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(&bound_function->function,
              (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              &local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  if (1 < (byte)((bound_function->super_BaseScalarFunction).return_type.physical_type_ +
                ~(VARCHAR|UINT8))) {
    bound_function->statistics =
         PropagateNumericStats<duckdb::TryDecimalSubtract,duckdb::SubtractPropagateStatistics,duckdb::SubtractOperator>
    ;
  }
  *(undefined8 *)this = local_40;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindDecimalAddSubtract(ClientContext &context, ScalarFunction &bound_function,
                                                vector<unique_ptr<Expression>> &arguments) {
	auto bind_data = BindDecimalArithmetic(context, bound_function, arguments);

	// now select the physical function to execute
	auto &result_type = bound_function.return_type;
	if (bind_data->check_overflow) {
		bound_function.function = GetScalarBinaryFunction<OPOVERFLOWCHECK>(result_type.InternalType());
	} else {
		bound_function.function = GetScalarBinaryFunction<OP>(result_type.InternalType());
	}
	if (result_type.InternalType() != PhysicalType::INT128 && result_type.InternalType() != PhysicalType::UINT128) {
		if (IS_SUBTRACT) {
			bound_function.statistics =
			    PropagateNumericStats<TryDecimalSubtract, SubtractPropagateStatistics, SubtractOperator>;
		} else {
			bound_function.statistics = PropagateNumericStats<TryDecimalAdd, AddPropagateStatistics, AddOperator>;
		}
	}
	return std::move(bind_data);
}